

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMap.hpp
# Opt level: O0

usize __thiscall MultiMap<int,_bool>::count(MultiMap<int,_bool> *this,int *key)

{
  bool bVar1;
  int *local_38;
  Item *item;
  usize count;
  Iterator it;
  int *key_local;
  MultiMap<int,_bool> *this_local;
  
  it.item = (Item *)key;
  count = (usize)find(this,key);
  bVar1 = Iterator::operator==((Iterator *)&count,&this->_end);
  if (bVar1) {
    this_local = (MultiMap<int,_bool> *)0x0;
  }
  else {
    item = (Item *)0x1;
    local_38 = *(int **)(count + 0x30);
    while( true ) {
      bVar1 = false;
      if (local_38 != (int *)0x0) {
        bVar1 = *local_38 == (it.item)->key;
      }
      if (!bVar1) break;
      item = (Item *)((long)&item->key + 1);
      local_38 = *(int **)(local_38 + 0xc);
    }
    this_local = (MultiMap<int,_bool> *)item;
  }
  return (usize)this_local;
}

Assistant:

usize count(const T& key)
  {
    Iterator it = find(key);
    if(it == _end)
      return 0;
    usize count = 1;
    for(Item* item = it.item->next; item && item->key == key; item = item->next)
      ++count;
    return count;
  }